

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

bool __thiscall
ON_Viewport::GetCoordinateSprite
          (ON_Viewport *this,int size,int scrx,int scry,int *indx,double (*scr_coord) [2])

{
  double dVar1;
  int iVar2;
  double dVar3;
  bool bVar4;
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  ON_3dPoint *__return_storage_ptr__;
  ON_3dPoint C;
  ON_3dVector Z;
  ON_3dVector X;
  ON_3dVector Scr [3];
  ON_3dPoint ZP;
  ON_3dPoint YP;
  ON_Xform w2s;
  ON_3dPoint local_1d0;
  double local_1b8;
  double dStack_1b0;
  ON_3dPoint local_1a0;
  ON_3dPoint local_188;
  ON_3dVector local_168;
  ON_3dVector local_150;
  ON_3dPoint local_138;
  ON_3dVector local_120;
  ON_3dVector local_108;
  ON_3dPoint local_e8;
  ON_3dPoint local_c8;
  ON_Xform local_b0;
  
  indx[0] = 0;
  indx[1] = 1;
  local_1b8 = (double)scrx;
  dStack_1b0 = (double)scry;
  indx[2] = 2;
  scr_coord[2][0] = local_1b8;
  scr_coord[2][1] = dStack_1b0;
  scr_coord[1][0] = local_1b8;
  scr_coord[1][1] = dStack_1b0;
  (*scr_coord)[0] = local_1b8;
  (*scr_coord)[1] = dStack_1b0;
  ON_Xform::ON_Xform(&local_b0);
  pdVar5 = ON_3dPoint::operator_cast_to_double_(&local_1d0);
  bVar4 = GetFrustumCenter(this,pdVar5);
  if (bVar4) {
    pdVar5 = ON_3dVector::operator_cast_to_double_(&local_150);
    pdVar6 = ON_3dVector::operator_cast_to_double_(&local_168);
    if (pdVar5 != (double *)0x0) {
      *pdVar5 = (this->m_CamX).x;
      pdVar5[1] = (this->m_CamX).y;
      pdVar5[2] = (this->m_CamX).z;
    }
    if (pdVar6 != (double *)0x0) {
      *pdVar6 = (this->m_CamZ).x;
      pdVar6[1] = (this->m_CamZ).y;
      pdVar6[2] = (this->m_CamZ).z;
    }
    if (this->m_bValidCamera == true) {
      bVar4 = GetXform(this,world_cs,screen_cs,&local_b0);
      if (!bVar4) {
        return false;
      }
      lVar9 = 0;
      lVar8 = 0;
      bVar4 = true;
      lVar7 = lVar9;
      do {
        do {
          bVar10 = bVar4;
          pdVar5 = ON_3dVector::operator[](&local_168,indx[lVar8]);
          dVar1 = *pdVar5;
          pdVar5 = ON_3dVector::operator[](&local_168,indx[lVar9 + 1]);
          if (*pdVar5 <= dVar1 && dVar1 != *pdVar5) {
            iVar2 = indx[lVar8];
            indx[lVar8] = indx[lVar9 + 1];
            indx[lVar9 + 1] = iVar2;
          }
          lVar9 = lVar9 + 1;
          bVar4 = bVar10;
        } while (lVar9 != 2);
        lVar9 = lVar7 + 1;
        lVar8 = 1;
        bVar4 = false;
        lVar7 = lVar9;
      } while (bVar10);
      ON_3dPoint::operator+(&local_188,&local_1d0,&local_150);
      ON_Xform::operator*(&local_138,&local_b0,&local_1d0);
      dVar1 = local_138.x;
      __return_storage_ptr__ = &local_138;
      ON_Xform::operator*(__return_storage_ptr__,&local_b0,&local_188);
      if ((dVar1 != local_138.x) || (NAN(dVar1) || NAN(local_138.x))) {
        local_e8.z = (double)size / ABS(dVar1 - local_138.x);
        local_188.y = local_1d0.y;
        local_188.z = local_1d0.z;
        local_188.x = local_1d0.x + local_e8.z;
        local_c8.x = local_1d0.x;
        local_c8.z = local_1d0.z;
        local_c8.y = local_1d0.y + local_e8.z;
        local_e8.x = local_1d0.x;
        local_e8.y = local_1d0.y;
        local_e8.z = local_e8.z + local_1d0.z;
        ON_Xform::operator*(&local_1a0,&local_b0,&local_188);
        ON_3dVector::operator=((ON_3dVector *)__return_storage_ptr__,&local_1a0);
        ON_Xform::operator*(&local_1a0,&local_b0,&local_c8);
        ON_3dVector::operator=(&local_120,&local_1a0);
        ON_Xform::operator*(&local_1a0,&local_b0,&local_e8);
        ON_3dVector::operator=(&local_108,&local_1a0);
        lVar7 = 0;
        do {
          dVar3 = __return_storage_ptr__->y;
          pdVar5 = (double *)((long)*scr_coord + lVar7);
          *pdVar5 = __return_storage_ptr__->x + (local_1b8 - dVar1);
          pdVar5[1] = dVar3 + (dStack_1b0 - local_138.y);
          lVar7 = lVar7 + 0x10;
          __return_storage_ptr__ = __return_storage_ptr__ + 1;
        } while (lVar7 != 0x30);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool ON_Viewport::GetCoordinateSprite( 
                     int size, 
                     int scrx, int scry,
                     int indx[3], // axis order by depth
                     double scr_coord[3][2] ) const
{
  // size = length of axes in pixels

  indx[0] = 0; indx[1] = 1; indx[2] = 2;
  scr_coord[0][0] = scr_coord[1][0] = scr_coord[2][0] = scrx;
  scr_coord[0][1] = scr_coord[1][1] = scr_coord[2][1] = scry;

  ON_3dPoint C, XP, YP, ZP, ScrC, ScrXP;
  ON_3dVector X, Z, Scr[3];
  ON_Xform w2s;
  if (!GetFrustumCenter( C ) )
    return false;
  if (!GetCameraFrame( nullptr, X, nullptr, Z )) 
    return false;
  if (!GetXform( ON::world_cs, ON::screen_cs, w2s )) 
    return false;

  // indx[] determines order that axes are drawn
  // sorted from back to front
  int i,j,k;
  for (i = 0; i < 2; i++) for (j = i+1; j <= 2; j++) {
    if (Z[indx[i]] > Z[indx[j]])
      {k = indx[i]; indx[i] = indx[j]; indx[j] = k;}
  }

  // determine world length that corresponds to size pixels
  XP = C+X;
  ScrC = w2s*C;
  ScrXP = w2s*XP;
  if (ScrC.x == ScrXP.x)
    return false;
  double s = size/fabs( ScrC.x - ScrXP.x );

  // transform world coord axes to screen
  XP = C;
  XP.x += s;
  YP = C;
  YP.y += s;
  ZP = C;
  ZP.z += s;
  Scr[0] = w2s*XP;
  Scr[1] = w2s*YP;
  Scr[2] = w2s*ZP;
  
  double dx = scrx - ScrC.x;
  double dy = scry - ScrC.y;
  for (i=0;i<3;i++) {
    scr_coord[i][0] = dx + Scr[i].x; 
    scr_coord[i][1] = dy + Scr[i].y;
  }

  return true;
}